

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O2

void Imf_3_4::loadDeepImage(string *fileName,Header *hdr,DeepImage *img)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  bool tiled;
  bool multiPart;
  bool deep;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  cVar2 = Imf_3_4::isOpenExrFile((fileName->_M_dataplus)._M_p,&tiled,&deep,&multiPart);
  if (cVar2 == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar5 = std::operator<<(local_1a0,"Cannot load image file ");
    poVar5 = std::operator<<(poVar5,(string *)fileName);
    std::operator<<(poVar5,".  The file is not an OpenEXR file.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (multiPart == true) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar5 = std::operator<<(local_1a0,"Cannot load image file ");
    poVar5 = std::operator<<(poVar5,(string *)fileName);
    std::operator<<(poVar5,".  Multi-part file loading is not supported.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (deep == false) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar5 = std::operator<<(local_1a0,"Cannot load flat image file ");
    poVar5 = std::operator<<(poVar5,(string *)fileName);
    std::operator<<(poVar5," as a deep image.");
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&_iex_throw_s,pcVar1,iVar3,true);
  iVar3 = Imf_3_4::MultiPartInputFile::parts();
  if (0 < iVar3) {
    Imf_3_4::MultiPartInputFile::header((int)&_iex_throw_s);
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      Imf_3_4::MultiPartInputFile::header((int)&_iex_throw_s);
      psVar4 = (string *)Imf_3_4::Header::type_abi_cxx11_();
      tiled = (bool)Imf_3_4::isTiled(psVar4);
      goto LAB_00116de4;
    }
  }
  tiled = false;
LAB_00116de4:
  MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&_iex_throw_s);
  if (tiled == true) {
    loadDeepTiledImage(fileName,hdr,img);
  }
  else {
    loadDeepScanLineImage(fileName,hdr,img);
  }
  return;
}

Assistant:

void
loadDeepImage (const string& fileName, Header& hdr, DeepImage& img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    if (!deep)
    {
        THROW (
            ArgExc,
            "Cannot load flat image file " << fileName
                                           << " "
                                              "as a deep image.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the OpenEXR library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str ());

        tiled =
            (mpi.parts () > 0 && mpi.header (0).hasType () &&
             isTiled (mpi.header (0).type ()));
    }

    if (tiled)
        loadDeepTiledImage (fileName, hdr, img);
    else
        loadDeepScanLineImage (fileName, hdr, img);
}